

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  char cVar1;
  Curl_easy *data;
  long lVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  size_t sVar8;
  char *pcVar9;
  curl_slist *item;
  curl_slist *pcVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  curltime cVar13;
  char *rawPath;
  ftp_conn *ftpc;
  int ftpcode;
  int ftpcode_1;
  ssize_t nread;
  ssize_t nread_1;
  char *local_68;
  undefined8 *local_60;
  ftp_conn *local_58;
  size_t local_50;
  int local_48;
  int local_44;
  long local_40;
  ssize_t local_38;
  
  data = conn->data;
  puVar11 = (undefined8 *)(data->req).protop;
  local_68 = (char *)0x0;
  local_50 = 0;
  if (puVar11 == (undefined8 *)0x0) {
    return CURLE_OK;
  }
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (CVar6 = CURLE_OK, premature)) {
    (conn->proto).ftpc.ctl_valid = false;
    (conn->proto).ftpc.cwdfail = true;
    Curl_conncontrol(conn,1);
    CVar6 = status;
  }
  if (((data->state).field_0x514 & 0x80) != 0) {
    if (((data->set).chunk_end != (curl_chunk_end_callback)0x0) &&
       ((conn->proto).ftpc.file != (char *)0x0)) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->wildcard).customptr);
      Curl_set_in_callback(data,false);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  if (CVar6 == CURLE_OK) {
    CVar6 = Curl_urldecode(data,(char *)*puVar11,0,&local_68,&local_50,true);
  }
  local_58 = (ftp_conn *)&conn->proto;
  if (CVar6 == CURLE_OK) {
    if (((data->set).ftp_filemethod == FTPFILE_NOCWD) && (*local_68 == '/')) {
      (*Curl_cfree)(local_68);
    }
    else {
      (*Curl_cfree)((conn->proto).ftpc.prevpath);
      if ((conn->proto).ftpc.cwdfail == false) {
        if ((data->set).ftp_filemethod == FTPFILE_NOCWD) {
          local_50 = 0;
        }
        else {
          pcVar9 = (conn->proto).ftpc.file;
          if (pcVar9 == (char *)0x0) {
            sVar8 = 0;
          }
          else {
            sVar8 = strlen(pcVar9);
          }
          local_50 = local_50 - sVar8;
        }
        local_68[local_50] = '\0';
        (conn->proto).ftpc.prevpath = local_68;
      }
      else {
        (*Curl_cfree)(local_68);
        (conn->proto).ftpc.prevpath = (char *)0x0;
      }
    }
    if ((conn->proto).ftpc.prevpath != (char *)0x0) {
      Curl_infof(data,"Remembering we are in dir \"%s\"\n");
    }
  }
  else {
    (conn->proto).ftpc.ctl_valid = false;
    Curl_conncontrol(conn,1);
    (*Curl_cfree)((conn->proto).ftpc.prevpath);
    (conn->proto).ftpc.prevpath = (char *)0x0;
  }
  freedirs(local_58);
  if (conn->sock[1] != -1) {
    if (((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, (conn->proto).ftpc.dont_check == true)) &&
       (0 < (data->req).maxdownload)) {
      CVar7 = Curl_pp_sendf(&local_58->pp,"%s","ABOR");
      CVar6 = CURLE_OK;
      if (CVar7 != CURLE_OK) {
        pcVar9 = curl_easy_strerror(CVar7);
        Curl_failf(data,"Failure sending ABOR command: %s",pcVar9);
        (conn->proto).ftpc.ctl_valid = false;
        Curl_conncontrol(conn,1);
        CVar6 = CVar7;
      }
    }
    if ((conn->ssl[1].field_0x10 & 1) != 0) {
      Curl_ssl_close(conn,1);
    }
    if (conn->sock[1] != -1) {
      Curl_closesocket(conn,conn->sock[1]);
      conn->sock[1] = -1;
    }
    (conn->bits).tcpconnect[1] = false;
  }
  if (CVar6 == CURLE_OK) {
    CVar6 = CURLE_OK;
    if (((*(int *)(puVar11 + 2) == 0) && ((conn->proto).ftpc.ctl_valid == true)) &&
       (CVar6 = CURLE_OK, (conn->proto).sshc.authed == true && !premature)) {
      lVar2 = (conn->proto).ftpc.pp.response_time;
      (conn->proto).ftpc.pp.response_time = 60000;
      local_60 = puVar11;
      cVar13 = Curl_now();
      (conn->proto).smbc.send_size = cVar13.tv_sec;
      *(int *)((long)&conn->proto + 0x48) = cVar13.tv_usec;
      CVar7 = Curl_GetFTPResponse(&local_40,conn,&local_48);
      (conn->proto).ftpc.pp.response_time = lVar2;
      if (CVar7 == CURLE_OPERATION_TIMEDOUT && local_40 == 0) {
        Curl_failf(data,"control connection looks dead");
        (conn->proto).ftpc.ctl_valid = false;
        Curl_conncontrol(conn,1);
      }
      if (CVar7 == CURLE_OK) {
        if ((conn->proto).ftpc.dont_check == true) {
          if ((data->req).maxdownload < 1) {
            CVar6 = CURLE_OK;
            bVar5 = true;
          }
          else {
            bVar5 = false;
            Curl_infof(data,"partial download completed, closing connection\n");
            Curl_conncontrol(conn,1);
            CVar6 = CURLE_OK;
          }
        }
        else {
          CVar6 = CURLE_OK;
          bVar5 = true;
          if ((local_48 != 0xe2) && (local_48 != 0xfa)) {
            Curl_failf(data,"server did not report OK, got %d");
            CVar6 = CURLE_PARTIAL_FILE;
          }
        }
      }
      else {
        bVar5 = false;
        CVar6 = CVar7;
      }
      puVar11 = local_60;
      if (!bVar5) {
        return CVar7;
      }
    }
  }
  if (CVar6 == CURLE_OK && !premature) {
    uVar3 = *(ulong *)&(data->set).field_0x8e8;
    if (((uint)uVar3 >> 0x1d & 1) == 0) {
      lVar2 = (data->req).size;
      if (((lVar2 == -1) || (lVar4 = (data->req).bytecount, lVar2 == lVar4)) ||
         (((data->state).crlf_conversions + lVar2 == lVar4 || ((data->req).maxdownload == lVar4))))
      {
        CVar6 = CURLE_OK;
        if ((((conn->proto).ftpc.dont_check == false) && (0 < lVar2)) &&
           (CVar6 = CURLE_OK, (data->req).bytecount == 0)) {
          Curl_failf(data,"No data was received!");
          CVar6 = CURLE_FTP_COULDNT_RETR_FILE;
        }
        goto LAB_001158d2;
      }
      Curl_failf(data,"Received only partial file: %ld bytes");
    }
    else {
      lVar2 = (data->state).infilesize;
      CVar6 = CURLE_OK;
      if ((((lVar2 == -1) || ((uVar3 & 0x40) != 0)) || (lVar2 == (data->req).writebytecount)) ||
         (*(int *)(puVar11 + 2) != 0)) goto LAB_001158d2;
      Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)",(data->req).bytecount);
    }
    CVar6 = CURLE_PARTIAL_FILE;
  }
LAB_001158d2:
  *(undefined4 *)(puVar11 + 2) = 0;
  (conn->proto).ftpc.dont_check = false;
  puVar12 = puVar11;
  if ((status == CURLE_OK && CVar6 == CURLE_OK) && !premature) {
    pcVar10 = (data->set).postquote;
    if (pcVar10 == (curl_slist *)0x0) {
      CVar6 = CURLE_OK;
    }
    else {
      do {
        local_60 = puVar12;
        pcVar9 = pcVar10->data;
        if (pcVar9 != (char *)0x0) {
          cVar1 = *pcVar9;
          bVar5 = false;
          CVar6 = Curl_pp_sendf(&local_58->pp,"%s",pcVar9 + (cVar1 == '*'));
          if (CVar6 == CURLE_OK) {
            cVar13 = Curl_now();
            (conn->proto).smbc.send_size = cVar13.tv_sec;
            *(int *)((long)&conn->proto + 0x48) = cVar13.tv_usec;
            CVar6 = Curl_GetFTPResponse(&local_38,conn,&local_44);
            if (CVar6 == CURLE_OK) {
              bVar5 = true;
              CVar6 = (CURLcode)puVar11;
              if ((cVar1 != '*') && (399 < local_44)) {
                bVar5 = false;
                Curl_failf(conn->data,"QUOT string not accepted: %s",pcVar9 + (cVar1 == '*'));
                CVar6 = CURLE_QUOTE_ERROR;
              }
            }
            else {
              bVar5 = false;
            }
          }
          puVar11 = (undefined8 *)(ulong)CVar6;
          puVar12 = local_60;
          if (!bVar5) goto LAB_00115aa7;
        }
        pcVar10 = pcVar10->next;
        puVar12 = local_60;
      } while (pcVar10 != (curl_slist *)0x0);
      CVar6 = CURLE_OK;
    }
  }
LAB_00115aa7:
  (*Curl_cfree)((void *)puVar12[1]);
  puVar12[1] = 0;
  return CVar6;
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                         bool premature)
{
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL;
  size_t pathLen = 0;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the url-decoded "raw" path */
    result = Curl_urldecode(data, ftp->path, 0, &rawPath, &pathLen, TRUE);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    free(ftpc->prevpath);
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else { /* remember working directory for connection reuse */
    if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
      free(rawPath); /* full path => no CWDs happened => keep ftpc->prevpath */
    else {
      free(ftpc->prevpath);

      if(!ftpc->cwdfail) {
        if(data->set.ftp_filemethod == FTPFILE_NOCWD)
          pathLen = 0; /* relative path => working directory is FTP home */
        else
          pathLen -= ftpc->file?strlen(ftpc->file):0; /* file is url-decoded */

        rawPath[pathLen] = '\0';
        ftpc->prevpath = rawPath;
      }
      else {
        free(rawPath);
        ftpc->prevpath = NULL; /* no path */
      }
    }

    if(ftpc->prevpath)
      infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
  }

  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(conn);
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.bytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}